

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifier.cpp
# Opt level: O2

bool __thiscall
vkt::texture::SampleVerifier::verifySampleTexelGridCoords
          (SampleVerifier *this,SampleArguments *args,Vec4 *result,IVec3 *gridCoordHi,
          IVec3 *gridCoordLo,Vec2 *lodBounds,int level,VkSamplerMipmapMode mipmapFilter,
          ostream *report)

{
  float fVar1;
  bool bVar2;
  ostream *poVar3;
  int layer;
  long lVar4;
  double dVar5;
  VkFilter filter;
  VkSamplerMipmapMode mipmapFilter_00;
  Vec4 idealMin;
  IVec3 baseTexel [2];
  IVec3 texelGridOffset [2];
  Vec4 idealMax;
  IVec3 gridCoord [2];
  
  layer = 0;
  if (this->m_imParams->isArrayed == true) {
    dVar5 = deRoundEven((double)args->layer);
    layer = (int)dVar5;
  }
  tcu::Vector<int,_3>::Vector(gridCoord,gridCoordHi);
  tcu::Vector<int,_3>::Vector(gridCoord + 1,gridCoordLo);
  lVar4 = 0;
  do {
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)((long)baseTexel[0].m_data + lVar4));
    lVar4 = lVar4 + 0xc;
  } while (lVar4 != 0x18);
  lVar4 = 0;
  do {
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)((long)texelGridOffset[0].m_data + lVar4));
    lVar4 = lVar4 + 0xc;
  } while (lVar4 != 0x18);
  for (lVar4 = 0; lVar4 != 0x18; lVar4 = lVar4 + 0xc) {
    util::calcTexelBaseOffset
              ((IVec3 *)((long)gridCoord[0].m_data + lVar4),this->m_coordBits,
               (IVec3 *)((long)baseTexel[0].m_data + lVar4),
               (IVec3 *)((long)texelGridOffset[0].m_data + lVar4));
  }
  fVar1 = lodBounds->m_data[1];
  if (lodBounds->m_data[0] <= 0.0) {
    std::operator<<(report,"Trying magnification...\n");
    if (this->m_samplerParams->magFilter == VK_FILTER_NEAREST) {
      poVar3 = std::operator<<(report,"Testing against nearest texel at ");
      poVar3 = tcu::operator<<(poVar3,baseTexel);
      std::operator<<(poVar3,"\n");
      tcu::Vector<float,_4>::Vector(&idealMin);
      tcu::Vector<float,_4>::Vector(&idealMax);
      fetchTexel(this,baseTexel,layer,level,VK_FILTER_NEAREST,&idealMin,&idealMax);
      bVar2 = util::isInRange<4>(result,&idealMin,&idealMax);
      if (bVar2) {
        return true;
      }
      poVar3 = std::operator<<(report,"Failed against ");
      poVar3 = tcu::operator<<(poVar3,&idealMin);
      poVar3 = std::operator<<(poVar3," through ");
      poVar3 = tcu::operator<<(poVar3,&idealMax);
      std::operator<<(poVar3,"\n");
    }
    else {
      idealMin.m_data[0] = 0.0;
      idealMin.m_data[1] = 0.0;
      bVar2 = verifySampleFiltered
                        (this,result,baseTexel,baseTexel + 1,texelGridOffset,texelGridOffset + 1,
                         layer,level,(Vec2 *)&idealMin,VK_FILTER_LINEAR,
                         VK_SAMPLER_MIPMAP_MODE_NEAREST,report);
      if (bVar2) {
        return true;
      }
    }
  }
  if (0.0 < fVar1) {
    std::operator<<(report,"Trying minification...\n");
    if (mipmapFilter == VK_SAMPLER_MIPMAP_MODE_LINEAR) {
      idealMax.m_data[0] = (float)level;
      idealMax.m_data[1] = idealMax.m_data[0];
      tcu::operator-(lodBounds,(Vector<float,_2> *)&idealMax);
      filter = this->m_samplerParams->minFilter;
      mipmapFilter_00 = VK_SAMPLER_MIPMAP_MODE_LINEAR;
    }
    else {
      if (this->m_samplerParams->minFilter != VK_FILTER_LINEAR) {
        poVar3 = std::operator<<(report,"Testing against nearest texel at ");
        poVar3 = tcu::operator<<(poVar3,baseTexel);
        std::operator<<(poVar3,"\n");
        tcu::Vector<float,_4>::Vector(&idealMin);
        tcu::Vector<float,_4>::Vector(&idealMax);
        fetchTexel(this,baseTexel,layer,level,VK_FILTER_NEAREST,&idealMin,&idealMax);
        bVar2 = util::isInRange<4>(result,&idealMin,&idealMax);
        if (!bVar2) {
          poVar3 = std::operator<<(report,"Failed against ");
          poVar3 = tcu::operator<<(poVar3,&idealMin);
          poVar3 = std::operator<<(poVar3," through ");
          poVar3 = tcu::operator<<(poVar3,&idealMax);
          std::operator<<(poVar3,"\n");
          return false;
        }
        return true;
      }
      idealMin.m_data[0] = 0.0;
      idealMin.m_data[1] = 0.0;
      mipmapFilter_00 = VK_SAMPLER_MIPMAP_MODE_NEAREST;
      filter = VK_FILTER_LINEAR;
    }
    bVar2 = verifySampleFiltered
                      (this,result,baseTexel,baseTexel + 1,texelGridOffset,texelGridOffset + 1,layer
                       ,level,(Vec2 *)&idealMin,filter,mipmapFilter_00,report);
    if (bVar2) {
      return true;
    }
  }
  return false;
}

Assistant:

bool SampleVerifier::verifySampleTexelGridCoords (const SampleArguments&	args,
												  const Vec4&				result,
												  const IVec3&				gridCoordHi,
												  const IVec3&				gridCoordLo,
												  const Vec2&				lodBounds,
												  int						level,
												  VkSamplerMipmapMode		mipmapFilter,
												  std::ostream&				report) const
{
	const int	layer		 = m_imParams.isArrayed ? (int)deRoundEven(args.layer) : 0U;
	const IVec3 gridCoord[2] = {gridCoordHi, gridCoordLo};

	IVec3 baseTexel[2];
	IVec3 texelGridOffset[2];

    for (int levelNdx = 0; levelNdx < 2; ++levelNdx)
	{
		calcTexelBaseOffset(gridCoord[levelNdx], m_coordBits, baseTexel[levelNdx], texelGridOffset[levelNdx]);
	}

	const bool	canBeMinified  = lodBounds[1] > 0.0f;
	const bool	canBeMagnified = lodBounds[0] <= 0.0f;

	if (canBeMagnified)
	{
		report << "Trying magnification...\n";

		if (m_samplerParams.magFilter == VK_FILTER_NEAREST)
		{
			report << "Testing against nearest texel at " << baseTexel[0] << "\n";

			Vec4 idealMin;
			Vec4 idealMax;

			fetchTexel(baseTexel[0], layer, level, VK_FILTER_NEAREST, idealMin, idealMax);

			if (isInRange(result, idealMin, idealMax))
		    {
				return true;
			}
			else
			{
				report << "Failed against " << idealMin << " through " << idealMax << "\n";
			}
		}
		else
		{
			if  (verifySampleFiltered(result, baseTexel[0], baseTexel[1], texelGridOffset[0], texelGridOffset[1], layer, level, Vec2(0.0f, 0.0f), VK_FILTER_LINEAR, VK_SAMPLER_MIPMAP_MODE_NEAREST, report))
				return true;
		}
	}

	if (canBeMinified)
	{
		report << "Trying minification...\n";

		if (mipmapFilter == VK_SAMPLER_MIPMAP_MODE_LINEAR)
		{
			const Vec2 lodFracBounds = lodBounds - Vec2((float)level);

			if (verifySampleFiltered(result, baseTexel[0], baseTexel[1], texelGridOffset[0], texelGridOffset[1], layer, level, lodFracBounds, m_samplerParams.minFilter, VK_SAMPLER_MIPMAP_MODE_LINEAR, report))
				return true;
		}
		else if (m_samplerParams.minFilter == VK_FILTER_LINEAR)
		{
		    if (verifySampleFiltered(result, baseTexel[0], baseTexel[1], texelGridOffset[0], texelGridOffset[1], layer, level, Vec2(0.0f, 0.0f), VK_FILTER_LINEAR, VK_SAMPLER_MIPMAP_MODE_NEAREST, report))
				return true;
		}
		else
		{
			report << "Testing against nearest texel at " << baseTexel[0] << "\n";

			Vec4 idealMin;
			Vec4 idealMax;

		    fetchTexel(baseTexel[0], layer, level, VK_FILTER_NEAREST, idealMin, idealMax);

			if (isInRange(result, idealMin, idealMax))
		    {
				return true;
			}
			else
			{
				report << "Failed against " << idealMin << " through " << idealMax << "\n";
			}
		}
	}

	return false;
}